

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_stats.c
# Opt level: O2

void cram_stats_del(cram_stats *st,int32_t val)

{
  int *piVar1;
  uint uVar2;
  kh_m_i2i_t *pkVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  
  st->nsamp = st->nsamp + -1;
  if ((uint)val < 0x400) {
    iVar7 = st->freqs[(uint)val];
    st->freqs[(uint)val] = iVar7 + -1;
    if (iVar7 < 1) {
      __assert_fail("st->freqs[val] >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_stats.c"
                    ,0x55,"void cram_stats_del(cram_stats *, int32_t)");
    }
  }
  else {
    pkVar3 = st->h;
    if (pkVar3 != (kh_m_i2i_t *)0x0) {
      uVar2 = pkVar3->n_buckets;
      if (uVar2 == 0) {
        uVar4 = 0;
LAB_00124fc1:
        if (uVar4 != uVar2) {
          piVar1 = pkVar3->vals + uVar4;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 != 0) {
            return;
          }
          if (pkVar3->n_buckets == uVar4) {
            return;
          }
          uVar2 = pkVar3->flags[uVar4 >> 4];
          uVar6 = uVar4 * 2 & 0x1e;
          if ((uVar2 >> (sbyte)uVar6 & 3) != 0) {
            return;
          }
          pkVar3->flags[uVar4 >> 4] = uVar2 | 1 << uVar6;
          pkVar3->size = pkVar3->size - 1;
          return;
        }
      }
      else {
        uVar6 = uVar2 - 1 & val;
        iVar7 = 1;
        uVar4 = uVar6;
        do {
          bVar5 = (char)uVar4 * '\x02' & 0x1e;
          uVar8 = pkVar3->flags[uVar4 >> 4] >> bVar5;
          if (((uVar8 & 2) != 0) || (((uVar8 & 1) == 0 && (pkVar3->keys[uVar4] == val)))) {
            if ((pkVar3->flags[uVar4 >> 4] >> bVar5 & 3) != 0) {
              uVar4 = uVar2;
            }
            goto LAB_00124fc1;
          }
          uVar4 = uVar4 + iVar7 & uVar2 - 1;
          iVar7 = iVar7 + 1;
        } while (uVar4 != uVar6);
      }
    }
    fprintf(_stderr,"Failed to remove val %d from cram_stats\n");
    st->nsamp = st->nsamp + 1;
  }
  return;
}

Assistant:

void cram_stats_del(cram_stats *st, int32_t val) {
    st->nsamp--;

    //assert(val >= 0);

    if (val < MAX_STAT_VAL && val >= 0) {
	st->freqs[val]--;
	assert(st->freqs[val] >= 0);
    } else if (st->h) {
	khint_t k = kh_get(m_i2i, st->h, val);

	if (k != kh_end(st->h)) {
	    if (--kh_val(st->h, k) == 0)
		kh_del(m_i2i, st->h, k);
	} else {
	    fprintf(stderr, "Failed to remove val %d from cram_stats\n", val);
	    st->nsamp++;
	}
    } else {
	fprintf(stderr, "Failed to remove val %d from cram_stats\n", val);
	st->nsamp++;
    }
}